

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::construct_helper<int(*)(int)>::_construct<int(&)(int),int,int>
          (_func_int_int *val,_func_int_int *target_function)

{
  cni_holder<int_(*)(int),_cs::numeric_(*)(cs::numeric)> *this;
  _func_int_int *local_18;
  
  this = (cni_holder<int_(*)(int),_cs::numeric_(*)(cs::numeric)> *)operator_new(0x28);
  local_18 = val;
  cni_holder<int_(*)(int),_cs::numeric_(*)(cs::numeric)>::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}